

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsStructTypes2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string shader_source;
  string structure_declaration;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&structure_declaration,
             "struct MyStructure {\n   float a[2], b[2][2], c[2][2][2], d[2][2][2][2], e[2][2][2][2][2], f[2][2][2][2][2][2], g[2][2][2][2][2][2][2], h[2][2][2][2][2][2][2][2];\n} myStructureObject;\n\n"
             ,(allocator<char> *)&shader_source);
  std::__cxx11::string::string((string *)&shader_source,(string *)&structure_declaration);
  std::__cxx11::string::append((string *)&shader_source);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b75a2e_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b75a2e_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x573);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
switchD_00b75a2e_caseD_0:
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_01721d10 + *(int *)(&DAT_01721d10 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void SizedDeclarationsStructTypes2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string structure_declaration = "struct MyStructure {\n"
										"   float a[2], "
										"b[2][2], "
										"c[2][2][2], "
										"d[2][2][2][2], "
										"e[2][2][2][2][2], "
										"f[2][2][2][2][2][2], "
										"g[2][2][2][2][2][2][2], "
										"h[2][2][2][2][2][2][2][2];\n"
										"} myStructureObject;\n\n";
	std::string shader_source = structure_declaration;

	shader_source += shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}